

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void set_cc_op(DisasContext_conflict2 *s,CCOp_conflict op)

{
  CCOp_conflict CVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  byte bVar2;
  int dead;
  CCOp_conflict old_op;
  TCGContext_conflict2 *tcg_ctx;
  CCOp_conflict op_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  CVar1 = s->cc_op;
  if (CVar1 != op) {
    s->cc_op = op;
    s->cc_op_synced = 0;
    bVar2 = "\x1f\x1f\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x18"[CVar1] &
            ("\x1f\x1f\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x18"[op] ^ 0xff);
    if ((bVar2 & 1) != 0) {
      tcg_gen_discard_i32(tcg_ctx_00,QREG_CC_C);
    }
    if ((bVar2 & 4) != 0) {
      tcg_gen_discard_i32(tcg_ctx_00,QREG_CC_Z);
    }
    if ((bVar2 & 2) != 0) {
      tcg_gen_discard_i32(tcg_ctx_00,QREG_CC_V);
    }
  }
  return;
}

Assistant:

static void set_cc_op(DisasContext *s, CCOp op)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    CCOp old_op = s->cc_op;
    int dead;

    if (old_op == op) {
        return;
    }
    s->cc_op = op;
    s->cc_op_synced = 0;

    /*
     * Discard CC computation that will no longer be used.
     * Note that X and N are never dead.
     */
    dead = cc_op_live[old_op] & ~cc_op_live[op];
    if (dead & CCF_C) {
        tcg_gen_discard_i32(tcg_ctx, QREG_CC_C);
    }
    if (dead & CCF_Z) {
        tcg_gen_discard_i32(tcg_ctx, QREG_CC_Z);
    }
    if (dead & CCF_V) {
        tcg_gen_discard_i32(tcg_ctx, QREG_CC_V);
    }
}